

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# naiveproxy.cpp
# Opt level: O0

void __thiscall naiveproxy::~naiveproxy(naiveproxy *this)

{
  naiveconfig *this_00;
  bool bVar1;
  reference ppnVar2;
  _Self local_20;
  _Self local_18;
  iterator it;
  naiveproxy *this_local;
  
  it._M_node = (_List_node_base *)this;
  if (this->oncefd != -1) {
    close(this->oncefd);
  }
  local_18._M_node =
       (_List_node_base *)
       std::__cxx11::list<naiveconfig_*,_std::allocator<naiveconfig_*>_>::begin(&this->cfgs);
  while( true ) {
    local_20._M_node =
         (_List_node_base *)
         std::__cxx11::list<naiveconfig_*,_std::allocator<naiveconfig_*>_>::end(&this->cfgs);
    bVar1 = std::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppnVar2 = std::_List_iterator<naiveconfig_*>::operator*(&local_18);
    this_00 = *ppnVar2;
    if (this_00 != (naiveconfig *)0x0) {
      naiveconfig::~naiveconfig(this_00);
      operator_delete(this_00);
    }
    std::_List_iterator<naiveconfig_*>::operator++(&local_18,0);
  }
  std::__cxx11::list<naiveconfig_*,_std::allocator<naiveconfig_*>_>::~list(&this->cfgs);
  return;
}

Assistant:

naiveproxy::~naiveproxy()
{
    //printf("destructor\n");
    //关闭打开文件
    if (oncefd != -1)
        close(oncefd);

    for (auto it = cfgs.begin(); it != cfgs.end(); it++)
    {
        delete *it;
    }
}